

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTimestepper.h
# Opt level: O2

void __thiscall
chrono::ChTimestepperEulerExplIIorder::~ChTimestepperEulerExplIIorder
          (ChTimestepperEulerExplIIorder *this)

{
  ~ChTimestepperEulerExplIIorder(this);
  ::operator_delete(this,0x98);
  return;
}

Assistant:

class ChApi ChTimestepperEulerExplIIorder : public ChTimestepperIIorder {
  protected:
    ChStateDelta Dv;

  public:
    /// Constructors (default empty)
    ChTimestepperEulerExplIIorder(ChIntegrableIIorder* intgr = nullptr) : ChTimestepperIIorder(intgr) {}

    virtual Type GetType() const override { return Type::EULER_EXPLICIT; }

    /// Performs an integration timestep
    virtual void Advance(const double dt  ///< timestep to advance
                         ) override;
}